

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_set_condexec(DisasContext_conflict1 *s)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  
  iVar1 = s->condexec_mask;
  if (iVar1 != 0) {
    tcg_ctx = s->uc->tcg_ctx;
    iVar2 = s->condexec_cond;
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_movi_i32(tcg_ctx,ret,iVar1 >> 1 | iVar2 << 4);
    store_cpu_offset(tcg_ctx,ret,0x224);
    return;
  }
  return;
}

Assistant:

static inline void gen_set_condexec(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->condexec_mask) {
        uint32_t val = (s->condexec_cond << 4) | (s->condexec_mask >> 1);
        TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_movi_i32(tcg_ctx, tmp, val);
        store_cpu_field(tcg_ctx, tmp, condexec_bits);
    }
}